

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

void free_D_Grammar(Grammar *g)

{
  Production **__ptr;
  Production *__ptr_00;
  Rule **__ptr_01;
  Rule *r;
  Elem *__ptr_02;
  Term **__ptr_03;
  Term *__ptr_04;
  Action **ppAVar1;
  State **__ptr_05;
  State *__ptr_06;
  Item **ppIVar2;
  Goto **__ptr_07;
  Hint **ppHVar3;
  Declaration **__ptr_08;
  D_Pass **__ptr_09;
  ScanState *pSVar4;
  ScanStateTransition *pSVar5;
  ulong uVar6;
  ScanState **__ptr_10;
  ScanStateTransition **__ptr_11;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  for (uVar7 = 0; __ptr = (g->productions).v, uVar7 < (g->productions).n; uVar7 = uVar7 + 1) {
    __ptr_00 = __ptr[uVar7];
    for (uVar8 = 0; __ptr_01 = (__ptr_00->rules).v, uVar8 < (__ptr_00->rules).n; uVar8 = uVar8 + 1)
    {
      r = __ptr_01[uVar8];
      if (r == g->r) {
        g->r = (Rule *)0x0;
      }
      for (uVar6 = 0; uVar6 < (r->elems).n; uVar6 = uVar6 + 1) {
        __ptr_02 = (r->elems).v[uVar6];
        if (__ptr_02 == __ptr_00->elem) {
          __ptr_00->elem = (Elem *)0x0;
        }
        free(__ptr_02);
      }
      if (r->end == __ptr_00->elem) {
        __ptr_00->elem = (Elem *)0x0;
      }
      free_rule(r);
    }
    if (__ptr_01 != (__ptr_00->rules).e && __ptr_01 != (Rule **)0x0) {
      free(__ptr_01);
    }
    (__ptr_00->rules).n = 0;
    (__ptr_00->rules).v = (Rule **)0x0;
    free(__ptr_00->name);
    if (__ptr_00->elem != (Elem *)0x0) {
      free_rule(__ptr_00->elem->rule);
      free(__ptr_00->elem);
    }
    free(__ptr_00);
  }
  if (__ptr != (g->productions).e && __ptr != (Production **)0x0) {
    free(__ptr);
  }
  (g->productions).n = 0;
  (g->productions).v = (Production **)0x0;
  for (uVar7 = 0; __ptr_03 = (g->terminals).v, uVar7 < (g->terminals).n; uVar7 = uVar7 + 1) {
    __ptr_04 = __ptr_03[uVar7];
    free(__ptr_04->string);
    free(__ptr_04->term_name);
    free(__ptr_04);
  }
  if (__ptr_03 != (g->terminals).e && __ptr_03 != (Term **)0x0) {
    free(__ptr_03);
  }
  (g->terminals).n = 0;
  (g->terminals).v = (Term **)0x0;
  for (uVar7 = 0; ppAVar1 = (g->actions).v, uVar7 < (g->actions).n; uVar7 = uVar7 + 1) {
    free_Action(ppAVar1[uVar7]);
  }
  if (ppAVar1 != (g->actions).e && ppAVar1 != (Action **)0x0) {
    free(ppAVar1);
  }
  (g->actions).n = 0;
  (g->actions).v = (Action **)0x0;
  free((g->scanner).code);
  for (uVar7 = 0; __ptr_05 = (g->states).v, uVar7 < (g->states).n; uVar7 = uVar7 + 1) {
    __ptr_06 = __ptr_05[uVar7];
    ppIVar2 = (__ptr_06->items).v;
    if (ppIVar2 != (__ptr_06->items).e && ppIVar2 != (Item **)0x0) {
      free(ppIVar2);
    }
    (__ptr_06->items).n = 0;
    (__ptr_06->items).v = (Item **)0x0;
    ppIVar2 = (__ptr_06->items_hash).v;
    if (ppIVar2 != (__ptr_06->items_hash).e && ppIVar2 != (Item **)0x0) {
      free(ppIVar2);
    }
    (__ptr_06->items_hash).n = 0;
    (__ptr_06->items_hash).v = (Item **)0x0;
    for (uVar8 = 0; __ptr_07 = (__ptr_06->gotos).v, uVar8 < (__ptr_06->gotos).n; uVar8 = uVar8 + 1)
    {
      free(__ptr_07[uVar8]->elem);
      free((__ptr_06->gotos).v[uVar8]);
    }
    if (__ptr_07 != (__ptr_06->gotos).e && __ptr_07 != (Goto **)0x0) {
      free(__ptr_07);
    }
    (__ptr_06->gotos).n = 0;
    (__ptr_06->gotos).v = (Goto **)0x0;
    ppAVar1 = (__ptr_06->shift_actions).v;
    if (ppAVar1 != (__ptr_06->shift_actions).e && ppAVar1 != (Action **)0x0) {
      free(ppAVar1);
    }
    (__ptr_06->shift_actions).n = 0;
    (__ptr_06->shift_actions).v = (Action **)0x0;
    ppAVar1 = (__ptr_06->reduce_actions).v;
    if (ppAVar1 != (__ptr_06->reduce_actions).e && ppAVar1 != (Action **)0x0) {
      free(ppAVar1);
    }
    (__ptr_06->reduce_actions).n = 0;
    (__ptr_06->reduce_actions).v = (Action **)0x0;
    for (uVar8 = 0; ppHVar3 = (__ptr_06->right_epsilon_hints).v,
        uVar8 < (__ptr_06->right_epsilon_hints).n; uVar8 = uVar8 + 1) {
      free(ppHVar3[uVar8]);
    }
    if (ppHVar3 != (__ptr_06->right_epsilon_hints).e && ppHVar3 != (Hint **)0x0) {
      free(ppHVar3);
    }
    (__ptr_06->right_epsilon_hints).n = 0;
    (__ptr_06->right_epsilon_hints).v = (Hint **)0x0;
    for (uVar8 = 0; ppHVar3 = (__ptr_06->error_recovery_hints).v,
        uVar8 < (__ptr_06->error_recovery_hints).n; uVar8 = uVar8 + 1) {
      free(ppHVar3[uVar8]);
    }
    if (ppHVar3 != (__ptr_06->error_recovery_hints).e && ppHVar3 != (Hint **)0x0) {
      free(ppHVar3);
    }
    (__ptr_06->error_recovery_hints).n = 0;
    (__ptr_06->error_recovery_hints).v = (Hint **)0x0;
    if (__ptr_06->same_shifts == (State *)0x0) {
      for (uVar8 = 0; __ptr_10 = (__ptr_06->scanner).states.v, uVar8 < (__ptr_06->scanner).states.n;
          uVar8 = uVar8 + 1) {
        pSVar4 = __ptr_10[uVar8];
        ppAVar1 = (pSVar4->accepts).v;
        if (ppAVar1 != (pSVar4->accepts).e && ppAVar1 != (Action **)0x0) {
          free(ppAVar1);
          __ptr_10 = (__ptr_06->scanner).states.v;
          pSVar4 = __ptr_10[uVar8];
        }
        (pSVar4->accepts).n = 0;
        (pSVar4->accepts).v = (Action **)0x0;
        pSVar4 = __ptr_10[uVar8];
        ppAVar1 = (pSVar4->live).v;
        if (ppAVar1 != (pSVar4->live).e && ppAVar1 != (Action **)0x0) {
          free(ppAVar1);
          __ptr_10 = (__ptr_06->scanner).states.v;
          pSVar4 = __ptr_10[uVar8];
        }
        (pSVar4->live).n = 0;
        (pSVar4->live).v = (Action **)0x0;
        free(__ptr_10[uVar8]);
      }
      if (__ptr_10 != (__ptr_06->scanner).states.e && __ptr_10 != (ScanState **)0x0) {
        free(__ptr_10);
      }
      (__ptr_06->scanner).states.n = 0;
      (__ptr_06->scanner).states.v = (ScanState **)0x0;
      for (uVar8 = 0; __ptr_11 = (__ptr_06->scanner).transitions.v,
          uVar8 < (__ptr_06->scanner).transitions.n; uVar8 = uVar8 + 1) {
        pSVar5 = __ptr_11[uVar8];
        if (pSVar5 != (ScanStateTransition *)0x0) {
          ppAVar1 = (pSVar5->live_diff).v;
          if (ppAVar1 != (pSVar5->live_diff).e && ppAVar1 != (Action **)0x0) {
            free(ppAVar1);
            __ptr_11 = (__ptr_06->scanner).transitions.v;
            pSVar5 = __ptr_11[uVar8];
          }
          (pSVar5->live_diff).n = 0;
          (pSVar5->live_diff).v = (Action **)0x0;
          pSVar5 = __ptr_11[uVar8];
          ppAVar1 = (pSVar5->accepts_diff).v;
          if (ppAVar1 != (pSVar5->accepts_diff).e && ppAVar1 != (Action **)0x0) {
            free(ppAVar1);
            __ptr_11 = (__ptr_06->scanner).transitions.v;
            pSVar5 = __ptr_11[uVar8];
          }
          (pSVar5->accepts_diff).n = 0;
          (pSVar5->accepts_diff).v = (Action **)0x0;
          free(__ptr_11[uVar8]);
        }
      }
      if (__ptr_11 != (__ptr_06->scanner).transitions.e && __ptr_11 != (ScanStateTransition **)0x0)
      {
        free(__ptr_11);
      }
      (__ptr_06->scanner).transitions.n = 0;
      (__ptr_06->scanner).transitions.v = (ScanStateTransition **)0x0;
    }
    free(__ptr_06->goto_valid);
    free(__ptr_06);
  }
  if (__ptr_05 != (g->states).e && __ptr_05 != (State **)0x0) {
    free(__ptr_05);
  }
  (g->states).n = 0;
  (g->states).v = (State **)0x0;
  lVar9 = 0;
  for (uVar7 = 0; uVar7 < g->ncode; uVar7 = uVar7 + 1) {
    free(*(void **)((long)&g->code->code + lVar9));
    lVar9 = lVar9 + 0x10;
  }
  free(g->code);
  for (uVar7 = 0; __ptr_08 = (g->declarations).v, uVar7 < (g->declarations).n; uVar7 = uVar7 + 1) {
    free(__ptr_08[uVar7]->elem);
    free((g->declarations).v[uVar7]);
  }
  if (__ptr_08 != (g->declarations).e && __ptr_08 != (Declaration **)0x0) {
    free(__ptr_08);
  }
  (g->declarations).n = 0;
  (g->declarations).v = (Declaration **)0x0;
  for (uVar7 = 0; __ptr_09 = (g->passes).v, uVar7 < (g->passes).n; uVar7 = uVar7 + 1) {
    free(__ptr_09[uVar7]->name);
    free((g->passes).v[uVar7]);
  }
  if (__ptr_09 != (g->passes).e && __ptr_09 != (D_Pass **)0x0) {
    free(__ptr_09);
  }
  (g->passes).n = 0;
  (g->passes).v = (D_Pass **)0x0;
  for (uVar7 = 0; uVar7 < (g->all_pathnames).n; uVar7 = uVar7 + 1) {
    free((g->all_pathnames).v[uVar7]);
  }
  free(g->pathname);
  free(g->default_white_space);
  free(g);
  return;
}

Assistant:

void free_D_Grammar(Grammar *g) {
  uint i, j, k;

  for (i = 0; i < g->productions.n; i++) {
    Production *p = g->productions.v[i];
    for (j = 0; j < p->rules.n; j++) {
      Rule *r = p->rules.v[j];
      if (r == g->r) g->r = 0;
      for (k = 0; k < r->elems.n; k++) {
        Elem *e = r->elems.v[k];
        if (e == p->elem) p->elem = 0;
        FREE(e);
      }
      if (r->end == p->elem) p->elem = 0;
      free_rule(r);
    }
    vec_free(&p->rules);
    FREE(p->name);
    if (p->elem) {
      free_rule(p->elem->rule);
      FREE(p->elem);
    }
    FREE(p);
  }
  vec_free(&g->productions);
  for (i = 0; i < g->terminals.n; i++) {
    Term *t = g->terminals.v[i];
    if (t->string) FREE(t->string);
    if (t->term_name) FREE(t->term_name);
    FREE(t);
  }
  vec_free(&g->terminals);
  for (i = 0; i < g->actions.n; i++) free_Action(g->actions.v[i]);
  vec_free(&g->actions);
  if (g->scanner.code) FREE(g->scanner.code);
  for (i = 0; i < g->states.n; i++) {
    State *s = g->states.v[i];
    vec_free(&s->items);
    vec_free(&s->items_hash);
    for (j = 0; j < s->gotos.n; j++) {
      FREE(s->gotos.v[j]->elem);
      FREE(s->gotos.v[j]);
    }
    vec_free(&s->gotos);
    vec_free(&s->shift_actions);
    vec_free(&s->reduce_actions);
    for (j = 0; j < s->right_epsilon_hints.n; j++) FREE(s->right_epsilon_hints.v[j]);
    vec_free(&s->right_epsilon_hints);
    for (j = 0; j < s->error_recovery_hints.n; j++) FREE(s->error_recovery_hints.v[j]);
    vec_free(&s->error_recovery_hints);
    if (!s->same_shifts) {
      for (j = 0; j < s->scanner.states.n; j++) {
        vec_free(&s->scanner.states.v[j]->accepts);
        vec_free(&s->scanner.states.v[j]->live);
        FREE(s->scanner.states.v[j]);
      }
      vec_free(&s->scanner.states);
      for (j = 0; j < s->scanner.transitions.n; j++)
        if (s->scanner.transitions.v[j]) {
          vec_free(&s->scanner.transitions.v[j]->live_diff);
          vec_free(&s->scanner.transitions.v[j]->accepts_diff);
          FREE(s->scanner.transitions.v[j]);
        }
      vec_free(&s->scanner.transitions);
    }
    FREE(s->goto_valid);
    FREE(s);
  }
  vec_free(&g->states);
  for (i = 0; i < g->ncode; i++) FREE(g->code[i].code);
  FREE(g->code);
  for (i = 0; i < g->declarations.n; i++) {
    FREE(g->declarations.v[i]->elem);
    FREE(g->declarations.v[i]);
  }
  vec_free(&g->declarations);
  for (i = 0; i < g->passes.n; i++) {
    FREE(g->passes.v[i]->name);
    FREE(g->passes.v[i]);
  }
  vec_free(&g->passes);
  for (i = 0; i < g->all_pathnames.n; i++) FREE(g->all_pathnames.v[i]);
  FREE(g->pathname);
  if (g->default_white_space) FREE(g->default_white_space);
  FREE(g);
}